

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

vector<basist::ktx2_transcoder::key_value> * __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::operator=
          (vector<basist::ktx2_transcoder::key_value> *this,
          vector<basist::ktx2_transcoder::key_value> *other)

{
  uint uVar1;
  void *pvVar2;
  uchar *puVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  long lVar6;
  key_value *pkVar7;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      pkVar7 = this->m_p;
      if (pkVar7 != (key_value *)0x0) {
        uVar1 = this->m_size;
        if ((ulong)uVar1 != 0) {
          lVar6 = 0;
          do {
            pvVar2 = *(void **)((long)&(pkVar7->m_value).m_p + lVar6);
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
            pvVar2 = *(void **)((long)&(pkVar7->m_key).m_p + lVar6);
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
            lVar6 = lVar6 + 0x20;
          } while ((ulong)uVar1 << 5 != lVar6);
        }
        free(this->m_p);
        this->m_p = (key_value *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,other->m_size,false,0x20,object_mover,false);
    }
    else {
      uVar1 = this->m_size;
      if ((ulong)uVar1 != 0) {
        pkVar7 = this->m_p;
        lVar6 = 0;
        do {
          pvVar2 = *(void **)((long)&(pkVar7->m_value).m_p + lVar6);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          pvVar2 = *(void **)((long)&(pkVar7->m_key).m_p + lVar6);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
          lVar6 = lVar6 + 0x20;
        } while ((ulong)uVar1 << 5 != lVar6);
        this->m_size = 0;
      }
    }
    uVar4 = other->m_size;
    if (uVar4 != 0) {
      pkVar7 = this->m_p;
      puVar5 = &(other->m_p->m_value).m_size;
      do {
        (pkVar7->m_key).m_p = (uchar *)0x0;
        (pkVar7->m_key).m_size = 0;
        (pkVar7->m_key).m_capacity = 0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)pkVar7,puVar5[-4],false,1,(object_mover)0x0,false);
        uVar1 = puVar5[-4];
        (pkVar7->m_key).m_size = uVar1;
        puVar3 = (pkVar7->m_key).m_p;
        if ((puVar3 != (uchar *)0x0) && (*(void **)(puVar5 + -6) != (void *)0x0)) {
          memcpy(puVar3,*(void **)(puVar5 + -6),(ulong)uVar1);
        }
        (pkVar7->m_value).m_p = (uchar *)0x0;
        (pkVar7->m_value).m_size = 0;
        (pkVar7->m_value).m_capacity = 0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)&pkVar7->m_value,*puVar5,false,1,(object_mover)0x0,false);
        uVar1 = *puVar5;
        (pkVar7->m_value).m_size = uVar1;
        puVar3 = (pkVar7->m_value).m_p;
        if ((puVar3 != (uchar *)0x0) && (((uint8_vec *)(puVar5 + -2))->m_p != (uchar *)0x0)) {
          memcpy(puVar3,((uint8_vec *)(puVar5 + -2))->m_p,(ulong)uVar1);
        }
        pkVar7 = pkVar7 + 1;
        puVar5 = puVar5 + 8;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }